

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O1

void ovf::detail::parse::v2::ovf_segment_data_action<ovf::detail::parse::v2::bytes_bin_8>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>,float>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *in,ovf_file *f,ovf_segment *segment,float *data)

{
  int iVar1;
  int iVar2;
  parser_state *ppVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  string bytes_str;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,(in->m_begin).data,
             (in->m_input->
             super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).m_current.data);
  ppVar3 = f->_state;
  iVar1 = ppVar3->max_data_index;
  if (0 < (long)iVar1) {
    iVar2 = segment->valuedim;
    iVar6 = ppVar3->current_column;
    lVar5 = 0;
    do {
      data[lVar5] = (float)*(double *)(local_48[0] + lVar5 * 8);
      ppVar3->current_column = iVar6 + 1;
      bVar4 = iVar2 <= iVar6;
      iVar6 = iVar6 + 1;
      if (bVar4) {
        ppVar3->current_column = 0;
        ppVar3->current_line = ppVar3->current_line + 1;
        iVar6 = 0;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  ppVar3->current_column = 0;
  ppVar3->current_line = 0;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

static void apply( const Input& in, ovf_file & f, const ovf_segment & segment, scalar * data )
            {
                std::string bytes_str = in.string();
                const uint8_t * bytes = reinterpret_cast<const uint8_t *>( bytes_str.c_str() );
                for( int idx=0; idx < f._state->max_data_index; ++idx )
                {
                    uint64_t ivalue = endian::from_little_64( &bytes[8*idx] );
                    double value = *reinterpret_cast<const double *>( &ivalue );

                    if( idx < f._state->max_data_index )
                    {
                        data[idx] = value;
                        ++f._state->current_column;
                    }

                    if( f._state->current_column > segment.valuedim )
                    {
                        f._state->current_column = 0;
                        ++f._state->current_line;
                    }
                }
                f._state->current_line = 0;
                f._state->current_column = 0;
            }